

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.h
# Opt level: O2

bool __thiscall sing::HttpRequest::keepAlive(HttpRequest *this)

{
  bool bVar1;
  bool bVar2;
  string connection;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Connection",(allocator<char> *)&local_30);
  getHeaders(&local_50,this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = std::operator==(&local_50,"Keep-Alive");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&local_50,"keep-alive");
    if (!bVar1) {
      if (this->version == HTTP11) {
        bVar1 = std::operator!=(&local_50,"close");
        if (bVar1) goto LAB_00113064;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Keep-Alive",&local_71)
      ;
      getHeaders(&local_70,this,&local_30);
      bVar2 = local_70._M_string_length != 0;
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
LAB_00113064:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar2;
}

Assistant:

bool keepAlive() const{
        std::string connection = getHeaders("Connection");
        bool res = (connection == "Keep-Alive" || connection == "keep-alive") 
            || (version == HTTP11 && connection != "close") 
            || (!getHeaders("Keep-Alive").empty());

        return res;
    }